

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall
BarrierTest_CtorThrow_Test::~BarrierTest_CtorThrow_Test(BarrierTest_CtorThrow_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(BarrierTest, CtorThrow)
{
  struct throwing_completion {
    throwing_completion() = default;
    throwing_completion(const throwing_completion&) = default;
    throwing_completion(throwing_completion&&) {
      // move constructor throw exception
      throw 42;  // int
    }
    void operator()() {}
  } completion;
  EXPECT_THROW((yamc::barrier<throwing_completion>{1, completion}), int);
}